

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O1

void __thiscall
ConfidentialAssetId_Constractor_Test::TestBody(ConfidentialAssetId_Constractor_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined1 uVar3;
  char cVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  ConfidentialAssetId assetid;
  AssertHelper local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70 [2];
  string local_60;
  AssertHelper local_40;
  ConfidentialAssetId local_38;
  
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_38);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_78,"assetid.GetHex().c_str()","\"\"",local_60._M_dataplus._M_p,"");
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_78.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_70[0].ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar5 = ((local_70[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x12,pcVar5);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
      local_60._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialAssetId::GetData();
  local_88.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize();
  local_40.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_78,"assetid.GetData().GetDataSize()","0",(unsigned_long *)&local_88,
             (int *)&local_40);
  if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_78.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_70[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_70[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x13,pcVar5);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
      local_60._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = cfd::core::ConfidentialAssetId::HasBlinding();
  local_78.data_._0_1_ = (internal)uVar3;
  local_88.data_ = local_88.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_60,"assetid.HasBlinding()","false",(bool *)&local_78,
             (bool *)&local_88);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x14,pcVar5);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
      local_78.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialAssetId::GetUnblindedData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_88,"assetid.GetUnblindedData().GetHex().c_str()","\"\"",
             local_60._M_dataplus._M_p,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_78.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_78.data_);
  }
  if (local_88.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_80.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x15,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_60._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
      local_60._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::core::ConfidentialAssetId::IsEmpty();
  local_78.data_._0_1_ = (internal)cVar4;
  local_70[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 == '\0') {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_78,(AssertionResult *)"assetid.IsEmpty()","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x16,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_88.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_88.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_88.data_ + 8))();
      }
      local_88.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_004f3078;
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ConfidentialAssetId, Constractor) {
  ConfidentialAssetId assetid;

  EXPECT_STREQ(assetid.GetHex().c_str(), "");
  EXPECT_EQ(assetid.GetData().GetDataSize(), 0);
  EXPECT_EQ(assetid.HasBlinding(), false);
  EXPECT_STREQ(assetid.GetUnblindedData().GetHex().c_str(), "");
  EXPECT_TRUE(assetid.IsEmpty());
}